

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int simple_next_token(uint8_t **pp,BOOL no_line_terminator)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  pbVar6 = *pp;
LAB_0012c049:
  do {
    pbVar5 = pbVar6;
    pbVar6 = pbVar5 + 1;
    bVar1 = *pbVar5;
    uVar2 = (uint)bVar1;
    uVar4 = (uint)bVar1;
    if (bVar1 < 0xd) {
      if ((bVar1 - 0xb < 2) || (uVar2 == 9)) goto LAB_0012c049;
      if (uVar2 != 10) goto LAB_0012c127;
    }
    else {
      if (0x2e < bVar1) {
        if (uVar4 != 0x2f) {
          if (uVar4 == 0x3d) {
            if (*pbVar6 == 0x3e) {
              return -0x5c;
            }
            return 0x3d;
          }
LAB_0012c127:
          if ((char)bVar1 < '\0') {
            uVar2 = lre_is_id_start(uVar2);
          }
          else {
            uVar2 = (uint)((lre_id_start_table_ascii[bVar1 >> 5] >> (uVar4 & 0x1f) & 1) != 0);
          }
          if (uVar2 == 0) {
            return (uint)bVar1;
          }
          if (uVar4 == 0x68 || bVar1 < 0x68) {
            if ((((uVar4 == 0x65) && (*pbVar6 == 0x78)) && (pbVar5[2] == 0x70)) &&
               (((pbVar5[3] == 0x6f && (pbVar5[4] == 0x72)) &&
                ((pbVar5[5] == 0x74 && (iVar3 = lre_js_is_ident_next((uint)pbVar5[6]), iVar3 == 0)))
                ))) {
              *pp = pbVar5 + 6;
              return -0x35;
            }
            if (uVar4 != 0x66) {
              return -0x7d;
            }
          }
          else {
            if (uVar4 != 0x6f) {
              if (uVar4 != 0x69) {
                return -0x7d;
              }
              if ((*pbVar6 == 0x6e) && (iVar3 = lre_js_is_ident_next((uint)pbVar5[2]), iVar3 == 0))
              {
                return -0x49;
              }
              if (*pbVar6 != 0x6d) {
                return -0x7d;
              }
              if (pbVar5[2] != 0x70) {
                return -0x7d;
              }
              if (pbVar5[3] != 0x6f) {
                return -0x7d;
              }
              if (pbVar5[4] != 0x72) {
                return -0x7d;
              }
              if (pbVar5[5] != 0x74) {
                return -0x7d;
              }
              iVar3 = lre_js_is_ident_next((uint)pbVar5[6]);
              if (iVar3 != 0) {
                return -0x7d;
              }
              *pp = pbVar5 + 6;
              return -0x33;
            }
            if ((*pbVar6 == 0x66) && (iVar3 = lre_js_is_ident_next((uint)pbVar5[2]), iVar3 == 0)) {
              return -0x27;
            }
            if (bVar1 != 0x66) {
              return -0x7d;
            }
          }
          if (((*pbVar6 == 0x75) && (pbVar5[2] == 0x6e)) &&
             ((pbVar5[3] == 99 &&
              ((((pbVar5[4] == 0x74 && (pbVar5[5] == 0x69)) && (pbVar5[6] == 0x6f)) &&
               ((pbVar5[7] == 0x6e && (iVar3 = lre_js_is_ident_next((uint)pbVar5[8]), iVar3 == 0))))
              )))) {
            return -0x3b;
          }
          return -0x7d;
        }
        if (*pbVar6 == 0x2f) {
          if (no_line_terminator != 0) {
            return 10;
          }
          while ((0xd < *pbVar6 || ((0x2401U >> (*pbVar6 & 0x1f) & 1) == 0))) {
            pbVar6 = pbVar6 + 1;
          }
        }
        else {
          if (*pbVar6 != 0x2a) {
            return (uint)bVar1;
          }
          pbVar6 = pbVar5 + 2;
          while( true ) {
            bVar1 = *pbVar6;
            if (bVar1 == 0xd) {
              if (no_line_terminator != 0) {
                return 10;
              }
            }
            else {
              if (bVar1 == 0) goto LAB_0012c049;
              if ((no_line_terminator != 0) && (bVar1 == 10)) {
                return 10;
              }
            }
            if ((bVar1 == 0x2a) && (pbVar6[1] == 0x2f)) break;
            pbVar6 = pbVar6 + 1;
          }
          pbVar6 = pbVar6 + 2;
        }
        goto LAB_0012c049;
      }
      if (uVar4 != 0xd) {
        if (uVar2 != 0x20) goto LAB_0012c127;
        goto LAB_0012c049;
      }
    }
    if (no_line_terminator != 0) {
      return 10;
    }
  } while( true );
}

Assistant:

static int simple_next_token(const uint8_t **pp, BOOL no_line_terminator)
{
    const uint8_t *p;
    uint32_t c;
    
    /* skip spaces and comments */
    p = *pp;
    for (;;) {
        switch(c = *p++) {
        case '\r':
        case '\n':
            if (no_line_terminator)
                return '\n';
            continue;
        case ' ':
        case '\t':
        case '\v':
        case '\f':
            continue;
        case '/':
            if (*p == '/') {
                if (no_line_terminator)
                    return '\n';
                while (*p && *p != '\r' && *p != '\n')
                    p++;
                continue;
            }
            if (*p == '*') {
                while (*++p) {
                    if ((*p == '\r' || *p == '\n') && no_line_terminator)
                        return '\n';
                    if (*p == '*' && p[1] == '/') {
                        p += 2;
                        break;
                    }
                }
                continue;
            }
            break;
        case '=':
            if (*p == '>')
                return TOK_ARROW;
            break;
        default:
            if (lre_js_is_ident_first(c)) {
                if (c == 'i') {
                    if (p[0] == 'n' && !lre_js_is_ident_next(p[1])) {
                        return TOK_IN;
                    }
                    if (p[0] == 'm' && p[1] == 'p' && p[2] == 'o' &&
                        p[3] == 'r' && p[4] == 't' &&
                        !lre_js_is_ident_next(p[5])) {
                        *pp = p + 5;
                        return TOK_IMPORT;
                    }
                } else if (c == 'o' && *p == 'f' && !lre_js_is_ident_next(p[1])) {
                    return TOK_OF;
                } else if (c == 'e' &&
                           p[0] == 'x' && p[1] == 'p' && p[2] == 'o' &&
                           p[3] == 'r' && p[4] == 't' &&
                           !lre_js_is_ident_next(p[5])) {
                    *pp = p + 5;
                    return TOK_EXPORT;
                } else if (c == 'f' && p[0] == 'u' && p[1] == 'n' &&
                         p[2] == 'c' && p[3] == 't' && p[4] == 'i' &&
                         p[5] == 'o' && p[6] == 'n' && !lre_js_is_ident_next(p[7])) {
                    return TOK_FUNCTION;
                }
                return TOK_IDENT;
            }
            break;
        }
        return c;
    }
}